

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command.cpp
# Opt level: O3

void __thiscall
dynamicgraph::command::Command::setParameterValues
          (Command *this,
          vector<dynamicgraph::command::Value,_std::allocator<dynamicgraph::command::Value>_>
          *values)

{
  pointer pVVar1;
  Type TVar2;
  ostream *poVar3;
  ExceptionAbstract *pEVar4;
  Type type;
  Type type_00;
  uint uVar5;
  pointer pVVar6;
  ulong uVar7;
  stringstream ss;
  string local_1f8;
  string local_1d8;
  undefined1 local_1b8 [392];
  
  pVVar6 = (values->
           super__Vector_base<dynamicgraph::command::Value,_std::allocator<dynamicgraph::command::Value>_>
           )._M_impl.super__Vector_impl_data._M_start;
  pVVar1 = (values->
           super__Vector_base<dynamicgraph::command::Value,_std::allocator<dynamicgraph::command::Value>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  if ((long)pVVar1 - (long)pVVar6 >> 4 !=
      (long)(this->valueTypeVector_).
            super__Vector_base<dynamicgraph::command::Value::Type,_std::allocator<dynamicgraph::command::Value::Type>_>
            ._M_impl.super__Vector_impl_data._M_finish -
      (long)(this->valueTypeVector_).
            super__Vector_base<dynamicgraph::command::Value::Type,_std::allocator<dynamicgraph::command::Value::Type>_>
            ._M_impl.super__Vector_impl_data._M_start >> 2) {
    pEVar4 = (ExceptionAbstract *)__cxa_allocate_exception(0x30);
    local_1f8._M_dataplus._M_p._0_4_ = 0;
    local_1b8._0_8_ = local_1b8 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_1b8,"wrong number of parameters","");
    ExceptionAbstract::ExceptionAbstract(pEVar4,(int *)&local_1f8,(string *)local_1b8);
    __cxa_throw(pEVar4,&ExceptionAbstract::typeinfo,ExceptionAbstract::~ExceptionAbstract);
  }
  if (pVVar1 != pVVar6) {
    uVar5 = 1;
    uVar7 = 0;
    do {
      TVar2 = Value::type(pVVar6 + uVar7);
      if (TVar2 != (this->valueTypeVector_).
                   super__Vector_base<dynamicgraph::command::Value::Type,_std::allocator<dynamicgraph::command::Value::Type>_>
                   ._M_impl.super__Vector_impl_data._M_start[uVar7]) {
        std::__cxx11::stringstream::stringstream((stringstream *)local_1b8);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)(local_1b8 + 0x10),"argument ",9);
        poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)(local_1b8 + 0x10));
        std::__ostream_insert<char,std::char_traits<char>>(poVar3," is of wrong type: ",0x13);
        Value::typeName_abi_cxx11_
                  (&local_1f8,
                   (Value *)(ulong)(this->valueTypeVector_).
                                   super__Vector_base<dynamicgraph::command::Value::Type,_std::allocator<dynamicgraph::command::Value::Type>_>
                                   ._M_impl.super__Vector_impl_data._M_start[uVar7],type);
        poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar3,(char *)CONCAT44(local_1f8._M_dataplus._M_p._4_4_,
                                                    local_1f8._M_dataplus._M_p._0_4_),
                            local_1f8._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar3," expected, got ",0xf);
        TVar2 = Value::type((values->
                            super__Vector_base<dynamicgraph::command::Value,_std::allocator<dynamicgraph::command::Value>_>
                            )._M_impl.super__Vector_impl_data._M_start + uVar7);
        Value::typeName_abi_cxx11_(&local_1d8,(Value *)(ulong)TVar2,type_00);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar3,(char *)CONCAT44(local_1d8._M_dataplus._M_p._4_4_,
                                           local_1d8._M_dataplus._M_p._0_4_),
                   local_1d8._M_string_length);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)CONCAT44(local_1d8._M_dataplus._M_p._4_4_,local_1d8._M_dataplus._M_p._0_4_) !=
            &local_1d8.field_2) {
          operator_delete((undefined1 *)
                          CONCAT44(local_1d8._M_dataplus._M_p._4_4_,local_1d8._M_dataplus._M_p._0_4_
                                  ),local_1d8.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)CONCAT44(local_1f8._M_dataplus._M_p._4_4_,local_1f8._M_dataplus._M_p._0_4_) !=
            &local_1f8.field_2) {
          operator_delete((undefined1 *)
                          CONCAT44(local_1f8._M_dataplus._M_p._4_4_,local_1f8._M_dataplus._M_p._0_4_
                                  ),local_1f8.field_2._M_allocated_capacity + 1);
        }
        pEVar4 = (ExceptionAbstract *)__cxa_allocate_exception(0x30);
        local_1d8._M_dataplus._M_p._0_4_ = 700;
        std::__cxx11::stringbuf::str();
        ExceptionAbstract::ExceptionAbstract(pEVar4,(int *)&local_1d8,&local_1f8);
        __cxa_throw(pEVar4,&ExceptionAbstract::typeinfo,ExceptionAbstract::~ExceptionAbstract);
      }
      uVar7 = (ulong)uVar5;
      pVVar6 = (values->
               super__Vector_base<dynamicgraph::command::Value,_std::allocator<dynamicgraph::command::Value>_>
               )._M_impl.super__Vector_impl_data._M_start;
      uVar5 = uVar5 + 1;
    } while (uVar7 < (ulong)((long)(values->
                                   super__Vector_base<dynamicgraph::command::Value,_std::allocator<dynamicgraph::command::Value>_>
                                   )._M_impl.super__Vector_impl_data._M_finish - (long)pVVar6 >> 4))
    ;
  }
  std::vector<dynamicgraph::command::Value,_std::allocator<dynamicgraph::command::Value>_>::
  operator=(&this->valueVector_,values);
  return;
}

Assistant:

void Command::setParameterValues(const std::vector<Value> &values) {
  const std::vector<Value::Type> &paramTypes = valueTypes();
  // Check that number of parameters is correct
  if (values.size() != paramTypes.size()) {
    throw ExceptionAbstract(ExceptionAbstract::ABSTRACT,
                            "wrong number of parameters");
  }
  // Check that each parameter is of correct type
  for (unsigned int iParam = 0; iParam < values.size(); iParam++) {
    if (values[iParam].type() != paramTypes[iParam]) {
      std::stringstream ss;
      ss << "argument " << iParam
         << " is of wrong type: " << Value::typeName(paramTypes[iParam])
         << " expected, got " << Value::typeName(values[iParam].type());
      throw ExceptionAbstract(ExceptionAbstract::TOOLS, ss.str());
    }
  }
  // Copy vector of values in private part
  valueVector_ = values;
}